

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
wasm::WATParser::Lexer::takeString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  string_view in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined1 local_68 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> result;
  
  in = next(this);
  anon_unknown_0::str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_68,in)
  ;
  if (result.
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
      _M_payload.
      super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
      .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>._M_payload
      ._M_value.str.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    this->pos = this->pos + (long)local_68;
    advance(this);
    if (result.
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>.
        _M_payload.
        super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
        .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>.
        _M_payload._40_1_ == '\x01') {
      std::
      _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ::_Optional_base(&__return_storage_ptr__->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         *)((long)&result.
                                   super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                   ._M_payload._M_value.super_LexResult + 8));
    }
    else {
      local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_68,1,
                            (long)local_68 - 2);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_98,&local_78,
                 (allocator<char> *)
                 &result.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                  ._M_payload.
                  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexStrResult,_true,_false,_false>
                  .
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                  .field_0x3f);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    std::_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>::
    ~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     *)local_68);
  }
  else {
    std::_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>::
    ~_Optional_base((_Optional_base<wasm::WATParser::(anonymous_namespace)::LexStrResult,_false,_false>
                     *)local_68);
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Lexer::takeString() {
  if (auto result = str(next())) {
    pos += result->span.size();
    advance();
    if (result->str) {
      return result->str;
    }
    // Remove quotes.
    return std::string(result->span.substr(1, result->span.size() - 2));
  }
  return std::nullopt;
}